

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info.cc
# Opt level: O2

string_view __thiscall
bloaty::dwarf::CompilationUnitSizes::ReadInitialLength
          (CompilationUnitSizes *this,string_view *remaining)

{
  char *pcVar1;
  uint uVar2;
  unsigned_long __pos;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  string_view sVar4;
  
  uVar2 = ReadFixed<unsigned_int,4ul>(remaining);
  if (uVar2 == 0xffffffff) {
    this->dwarf64_ = true;
    __pos = ReadFixed<unsigned_long,8ul>(remaining);
  }
  else {
    __pos = (unsigned_long)uVar2;
    this->dwarf64_ = false;
  }
  if (__pos <= remaining->_M_len) {
    pcVar1 = remaining->_M_str;
    bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (remaining,__pos,0xffffffffffffffff);
    remaining->_M_len = bVar3._M_len;
    remaining->_M_str = bVar3._M_str;
    sVar4._M_str = pcVar1;
    sVar4._M_len = __pos;
    return sVar4;
  }
  Throw("short DWARF compilation unit",0x59);
}

Assistant:

std::string_view CompilationUnitSizes::ReadInitialLength(
    std::string_view* remaining) {
  uint64_t len = ReadFixed<uint32_t>(remaining);

  if (len == 0xffffffff) {
    dwarf64_ = true;
    len = ReadFixed<uint64_t>(remaining);
  } else {
    dwarf64_ = false;
  }

  if (remaining->size() < len) {
    THROW("short DWARF compilation unit");
  }

  std::string_view unit = *remaining;
  unit.remove_suffix(remaining->size() - len);
  *remaining = remaining->substr(len);
  return unit;
}